

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

int xmlRegExecPushStringInternal(xmlRegExecCtxtPtr exec,xmlChar *value,void *data,int compound)

{
  xmlRegTrans *pxVar1;
  uint uVar2;
  xmlRegexpPtr comp;
  xmlRegAtomPtr pxVar3;
  xmlRegCounter *pxVar4;
  xmlRegStatePtr pxVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  xmlRegStatePtr pxVar10;
  xmlChar *pxVar11;
  xmlRegInputTokenPtr pxVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  xmlChar *str1;
  uint uVar17;
  long lVar18;
  xmlRegTrans *pxVar19;
  bool bVar20;
  
  iVar7 = -1;
  if (((exec != (xmlRegExecCtxtPtr)0x0) && (comp = exec->comp, comp != (xmlRegexpPtr)0x0)) &&
     (iVar7 = exec->status, iVar7 == 0)) {
    if (comp->compact != (int *)0x0) {
      iVar7 = xmlRegCompactPushString(exec,comp,value,data);
      return iVar7;
    }
    if (value == (xmlChar *)0x0) {
      if (exec->state->type == XML_REGEXP_FINAL_STATE) {
        return 1;
      }
      str1 = (xmlChar *)0x0;
    }
    else {
      str1 = value;
      if (0 < exec->inputStackNr) {
        xmlFARegExecSaveInputString(exec,value,data);
        data = exec->inputStack[exec->index].data;
        str1 = exec->inputStack[exec->index].value;
      }
    }
    iVar7 = exec->status;
    bVar20 = iVar7 == 0;
    if (bVar20) {
      bVar6 = true;
      iVar7 = 0;
      do {
        if (str1 == (xmlChar *)0x0) {
          if ((value != (xmlChar *)0x0) || (exec->state->type == XML_REGEXP_FINAL_STATE)) {
            if (!bVar20) {
              return iVar7;
            }
            return (uint)(exec->state->type == XML_REGEXP_FINAL_STATE);
          }
          if (exec->counts != (int *)0x0) goto LAB_001a6bf6;
          str1 = (xmlChar *)0x0;
LAB_001a71d3:
          if (bVar6) {
            bVar6 = true;
            if ((exec->state != (xmlRegStatePtr)0x0) && (exec->state->type != XML_REGEXP_SINK_STATE)
               ) {
              if (exec->errString != (xmlChar *)0x0) {
                (*xmlFree)(exec->errString);
              }
              pxVar11 = xmlStrdup(str1);
              exec->errString = pxVar11;
              exec->errState = exec->state;
              lVar16 = (long)exec->comp->nbCounters;
              if (lVar16 != 0) {
                memcpy(exec->errCounts,exec->counts,lVar16 << 2);
              }
              goto LAB_001a7256;
            }
          }
          else {
LAB_001a7256:
            bVar6 = false;
          }
          exec->determinist = 0;
          xmlFARegExecRollBack(exec);
          pxVar12 = exec->inputStack;
          if ((pxVar12 != (xmlRegInputTokenPtr)0x0) && (exec->status == 0)) {
            iVar7 = exec->index;
LAB_001a7282:
            str1 = pxVar12[iVar7].value;
            data = pxVar12[iVar7].data;
          }
        }
        else {
LAB_001a6bf6:
          exec->transcount = 0;
          uVar17 = exec->transno;
          while( true ) {
            uVar2 = exec->state->nbTrans;
            if ((int)uVar2 <= (int)uVar17) break;
            pxVar19 = exec->state->trans;
            iVar7 = pxVar19[(int)uVar17].to;
            if (-1 < (long)iVar7) {
              pxVar1 = pxVar19 + (int)uVar17;
              pxVar3 = pxVar1->atom;
              uVar13 = pxVar1->count;
              uVar14 = (ulong)uVar13;
              if (uVar14 == 0x123457) {
                if (str1 == (xmlChar *)0x0) {
                  uVar13 = (uint)(value == (xmlChar *)0x0 && str1 == (xmlChar *)0x0);
                }
                else {
                  pxVar10 = exec->state;
                  uVar13 = 0;
                  if (0 < pxVar10->nbTrans) {
                    lVar18 = 0;
                    lVar16 = 0;
                    do {
                      lVar15 = (long)*(int *)((long)&pxVar10->trans->counter + lVar18);
                      if ((-1 < lVar15) &&
                         (pxVar19 = (xmlRegTrans *)((long)&pxVar10->trans->atom + lVar18),
                         pxVar19 != pxVar1)) {
                        pxVar4 = exec->comp->counters;
                        iVar7 = exec->counts[lVar15];
                        if ((iVar7 < pxVar4[lVar15].max) &&
                           ((pxVar19->atom != (xmlRegAtomPtr)0x0 &&
                            (iVar8 = xmlStrEqual(str1,(xmlChar *)pxVar19->atom->valuep), iVar8 != 0)
                            ))) break;
                        if ((pxVar4[lVar15].min <= iVar7) &&
                           (((iVar7 < pxVar4[lVar15].max && (pxVar19->atom != (xmlRegAtomPtr)0x0))
                            && (iVar7 = xmlStrEqual(str1,(xmlChar *)pxVar19->atom->valuep),
                               iVar7 != 0)))) {
                          uVar13 = 1;
                          goto LAB_001a6fe4;
                        }
                      }
                      lVar16 = lVar16 + 1;
                      pxVar10 = exec->state;
                      lVar18 = lVar18 + 0x18;
                    } while (lVar16 < pxVar10->nbTrans);
                    goto LAB_001a6fe1;
                  }
                }
              }
              else if (uVar13 == 0x123456) {
                uVar13 = 1;
                if (0 < (int)uVar2) {
                  lVar16 = 0;
                  do {
                    if (((ulong)uVar17 * 0x18 != lVar16) &&
                       (uVar13 = *(uint *)((long)&pxVar19->counter + lVar16), -1 < (int)uVar13)) {
                      pxVar4 = exec->comp->counters;
                      if ((exec->counts[uVar13] < pxVar4[uVar13].min) ||
                         (pxVar4[uVar13].max < exec->counts[uVar13])) goto LAB_001a6fe1;
                    }
                    lVar16 = lVar16 + 0x18;
                  } while ((ulong)uVar2 * 0x18 != lVar16);
LAB_001a6cbd:
                  uVar13 = 1;
                }
              }
              else if ((int)uVar13 < 0) {
                if (pxVar3 == (xmlRegAtomPtr)0x0) {
                  xmlRegExecPushStringInternal_cold_1();
                  break;
                }
                if (str1 == (xmlChar *)0x0) {
                  str1 = (xmlChar *)0x0;
                }
                else {
                  uVar9 = xmlRegStrEqualWildcard((xmlChar *)pxVar3->valuep,str1);
                  uVar13 = uVar9 ^ 1;
                  if (compound == 0) {
                    uVar13 = 0;
                  }
                  if (pxVar3->neg == 0) {
                    uVar13 = uVar9;
                  }
                  if ((uVar13 != 0) &&
                     ((lVar16 = (long)pxVar1->counter, lVar16 < 0 ||
                      (exec->counts[lVar16] < exec->comp->counters[lVar16].max)))) {
                    if ((pxVar3->min < 1) || (pxVar3->max < 1)) goto LAB_001a6cbd;
                    pxVar10 = exec->comp->states[iVar7];
                    if ((int)(uVar17 + 1) < (int)uVar2) {
                      if (exec->inputStackNr < 1) {
                        xmlFARegExecSaveInputString(exec,str1,data);
                      }
                      xmlFARegExecSave(exec);
                    }
                    exec->transcount = 1;
                    uVar13 = 1;
                    if (pxVar3->max != 1) {
                      iVar7 = 1;
                      do {
                        iVar8 = exec->index;
                        lVar16 = (long)iVar8 + 1;
                        exec->index = (int)lVar16;
                        str1 = exec->inputStack[lVar16].value;
                        data = exec->inputStack[lVar16].data;
                        if (str1 == (xmlChar *)0x0) {
                          exec->index = iVar8;
                          str1 = (xmlChar *)0x0;
                          break;
                        }
                        if (pxVar3->min <= iVar7) {
                          iVar7 = exec->transno;
                          pxVar5 = exec->state;
                          exec->transno = -1;
                          exec->state = pxVar10;
                          if (exec->inputStackNr < 1) {
                            xmlFARegExecSaveInputString(exec,str1,data);
                          }
                          xmlFARegExecSave(exec);
                          exec->transno = iVar7;
                          exec->state = pxVar5;
                        }
                        uVar13 = xmlStrEqual(str1,(xmlChar *)pxVar3->valuep);
                        exec->transcount = exec->transcount + 1;
                        if (uVar13 != 1) goto LAB_001a702e;
                        iVar7 = exec->transcount;
                      } while (iVar7 != pxVar3->max);
                      uVar13 = 1;
                    }
LAB_001a702e:
                    if (exec->transcount < pxVar3->min) {
                      uVar13 = 0;
                    }
                    if (0 < (int)uVar13) goto LAB_001a6fe4;
                    goto LAB_001a71d3;
                  }
                }
LAB_001a6fe1:
                uVar13 = 0;
              }
              else {
                pxVar4 = exec->comp->counters;
                uVar13 = 0;
                if (pxVar4[uVar14].min <= exec->counts[uVar14]) {
                  uVar13 = (uint)(exec->counts[uVar14] <= pxVar4[uVar14].max);
                }
              }
LAB_001a6fe4:
              if (uVar13 == 1) {
                if (((exec->callback != (xmlRegExecCallbacks)0x0) && (pxVar3 != (xmlRegAtomPtr)0x0))
                   && (data != (void *)0x0)) {
                  (*exec->callback)((xmlRegExecCtxtPtr)exec->data,(xmlChar *)pxVar3->valuep,
                                    pxVar3->data,data);
                }
                if (exec->transno + 1 < exec->state->nbTrans) {
                  if (exec->inputStackNr < 1) {
                    xmlFARegExecSaveInputString(exec,str1,data);
                  }
                  xmlFARegExecSave(exec);
                }
                if (-1 < (long)pxVar1->counter) {
                  exec->counts[pxVar1->counter] = exec->counts[pxVar1->counter] + 1;
                }
                if ((ulong)(uint)pxVar1->count < 0x123456) {
                  exec->counts[(uint)pxVar1->count] = 0;
                }
                pxVar10 = exec->comp->states[pxVar1->to];
                if ((pxVar10 != (xmlRegStatePtr)0x0) && (pxVar10->type == XML_REGEXP_SINK_STATE)) {
                  if (exec->errString != (xmlChar *)0x0) {
                    (*xmlFree)(exec->errString);
                  }
                  pxVar11 = xmlStrdup(str1);
                  exec->errString = pxVar11;
                  exec->errState = exec->state;
                  memcpy(exec->errCounts,exec->counts,(long)exec->comp->nbCounters << 2);
                }
                exec->state = exec->comp->states[pxVar1->to];
                exec->transno = 0;
                if (pxVar1->atom == (xmlRegAtomPtr)0x0) {
                  bVar6 = true;
                  goto LAB_001a7292;
                }
                pxVar12 = exec->inputStack;
                if (pxVar12 != (xmlRegInputTokenPtr)0x0) {
                  iVar7 = exec->index + 1;
                  exec->index = iVar7;
                  if (iVar7 < exec->inputStackNr) {
                    bVar6 = true;
                    goto LAB_001a7282;
                  }
                }
                bVar6 = true;
                data = (void *)0x0;
                str1 = (xmlChar *)0x0;
                goto LAB_001a7292;
              }
            }
            uVar17 = exec->transno + 1;
            exec->transno = uVar17;
          }
          if ((exec->transno != 0) || (exec->state->nbTrans == 0)) goto LAB_001a71d3;
        }
LAB_001a7292:
        iVar7 = exec->status;
        bVar20 = iVar7 == 0;
      } while (bVar20);
    }
  }
  return iVar7;
}

Assistant:

static int
xmlRegExecPushStringInternal(xmlRegExecCtxtPtr exec, const xmlChar *value,
	                     void *data, int compound) {
    xmlRegTransPtr trans;
    xmlRegAtomPtr atom;
    int ret;
    int final = 0;
    int progress = 1;

    if (exec == NULL)
	return(-1);
    if (exec->comp == NULL)
	return(-1);
    if (exec->status != 0)
	return(exec->status);

    if (exec->comp->compact != NULL)
	return(xmlRegCompactPushString(exec, exec->comp, value, data));

    if (value == NULL) {
        if (exec->state->type == XML_REGEXP_FINAL_STATE)
	    return(1);
	final = 1;
    }

#ifdef DEBUG_PUSH
    printf("value pushed: %s\n", value);
#endif
    /*
     * If we have an active rollback stack push the new value there
     * and get back to where we were left
     */
    if ((value != NULL) && (exec->inputStackNr > 0)) {
	xmlFARegExecSaveInputString(exec, value, data);
	value = exec->inputStack[exec->index].value;
	data = exec->inputStack[exec->index].data;
#ifdef DEBUG_PUSH
	printf("value loaded: %s\n", value);
#endif
    }

    while ((exec->status == 0) &&
	   ((value != NULL) ||
	    ((final == 1) &&
	     (exec->state->type != XML_REGEXP_FINAL_STATE)))) {

	/*
	 * End of input on non-terminal state, rollback, however we may
	 * still have epsilon like transition for counted transitions
	 * on counters, in that case don't break too early.
	 */
	if ((value == NULL) && (exec->counts == NULL))
	    goto rollback;

	exec->transcount = 0;
	for (;exec->transno < exec->state->nbTrans;exec->transno++) {
	    trans = &exec->state->trans[exec->transno];
	    if (trans->to < 0)
		continue;
	    atom = trans->atom;
	    ret = 0;
	    if (trans->count == REGEXP_ALL_LAX_COUNTER) {
		int i;
		int count;
		xmlRegTransPtr t;
		xmlRegCounterPtr counter;

		ret = 0;

#ifdef DEBUG_PUSH
		printf("testing all lax %d\n", trans->count);
#endif
		/*
		 * Check all counted transitions from the current state
		 */
		if ((value == NULL) && (final)) {
		    ret = 1;
		} else if (value != NULL) {
		    for (i = 0;i < exec->state->nbTrans;i++) {
			t = &exec->state->trans[i];
			if ((t->counter < 0) || (t == trans))
			    continue;
			counter = &exec->comp->counters[t->counter];
			count = exec->counts[t->counter];
			if ((count < counter->max) &&
		            (t->atom != NULL) &&
			    (xmlStrEqual(value, t->atom->valuep))) {
			    ret = 0;
			    break;
			}
			if ((count >= counter->min) &&
			    (count < counter->max) &&
			    (t->atom != NULL) &&
			    (xmlStrEqual(value, t->atom->valuep))) {
			    ret = 1;
			    break;
			}
		    }
		}
	    } else if (trans->count == REGEXP_ALL_COUNTER) {
		int i;
		int count;
		xmlRegTransPtr t;
		xmlRegCounterPtr counter;

		ret = 1;

#ifdef DEBUG_PUSH
		printf("testing all %d\n", trans->count);
#endif
		/*
		 * Check all counted transitions from the current state
		 */
		for (i = 0;i < exec->state->nbTrans;i++) {
                    t = &exec->state->trans[i];
		    if ((t->counter < 0) || (t == trans))
			continue;
                    counter = &exec->comp->counters[t->counter];
		    count = exec->counts[t->counter];
		    if ((count < counter->min) || (count > counter->max)) {
			ret = 0;
			break;
		    }
		}
	    } else if (trans->count >= 0) {
		int count;
		xmlRegCounterPtr counter;

		/*
		 * A counted transition.
		 */

		count = exec->counts[trans->count];
		counter = &exec->comp->counters[trans->count];
#ifdef DEBUG_PUSH
		printf("testing count %d: val %d, min %d, max %d\n",
		       trans->count, count, counter->min,  counter->max);
#endif
		ret = ((count >= counter->min) && (count <= counter->max));
	    } else if (atom == NULL) {
		fprintf(stderr, "epsilon transition left at runtime\n");
		exec->status = -2;
		break;
	    } else if (value != NULL) {
		ret = xmlRegStrEqualWildcard(atom->valuep, value);
		if (atom->neg) {
		    ret = !ret;
		    if (!compound)
		        ret = 0;
		}
		if ((ret == 1) && (trans->counter >= 0)) {
		    xmlRegCounterPtr counter;
		    int count;

		    count = exec->counts[trans->counter];
		    counter = &exec->comp->counters[trans->counter];
		    if (count >= counter->max)
			ret = 0;
		}

		if ((ret == 1) && (atom->min > 0) && (atom->max > 0)) {
		    xmlRegStatePtr to = exec->comp->states[trans->to];

		    /*
		     * this is a multiple input sequence
		     */
		    if (exec->state->nbTrans > exec->transno + 1) {
			if (exec->inputStackNr <= 0) {
			    xmlFARegExecSaveInputString(exec, value, data);
			}
			xmlFARegExecSave(exec);
		    }
		    exec->transcount = 1;
		    do {
			/*
			 * Try to progress as much as possible on the input
			 */
			if (exec->transcount == atom->max) {
			    break;
			}
			exec->index++;
			value = exec->inputStack[exec->index].value;
			data = exec->inputStack[exec->index].data;
#ifdef DEBUG_PUSH
			printf("value loaded: %s\n", value);
#endif

			/*
			 * End of input: stop here
			 */
			if (value == NULL) {
			    exec->index --;
			    break;
			}
			if (exec->transcount >= atom->min) {
			    int transno = exec->transno;
			    xmlRegStatePtr state = exec->state;

			    /*
			     * The transition is acceptable save it
			     */
			    exec->transno = -1; /* trick */
			    exec->state = to;
			    if (exec->inputStackNr <= 0) {
				xmlFARegExecSaveInputString(exec, value, data);
			    }
			    xmlFARegExecSave(exec);
			    exec->transno = transno;
			    exec->state = state;
			}
			ret = xmlStrEqual(value, atom->valuep);
			exec->transcount++;
		    } while (ret == 1);
		    if (exec->transcount < atom->min)
			ret = 0;

		    /*
		     * If the last check failed but one transition was found
		     * possible, rollback
		     */
		    if (ret < 0)
			ret = 0;
		    if (ret == 0) {
			goto rollback;
		    }
		}
	    }
	    if (ret == 1) {
		if ((exec->callback != NULL) && (atom != NULL) &&
			(data != NULL)) {
		    exec->callback(exec->data, atom->valuep,
			           atom->data, data);
		}
		if (exec->state->nbTrans > exec->transno + 1) {
		    if (exec->inputStackNr <= 0) {
			xmlFARegExecSaveInputString(exec, value, data);
		    }
		    xmlFARegExecSave(exec);
		}
		if (trans->counter >= 0) {
#ifdef DEBUG_PUSH
		    printf("Increasing count %d\n", trans->counter);
#endif
		    exec->counts[trans->counter]++;
		}
		if ((trans->count >= 0) &&
		    (trans->count < REGEXP_ALL_COUNTER)) {
#ifdef DEBUG_REGEXP_EXEC
		    printf("resetting count %d on transition\n",
		           trans->count);
#endif
		    exec->counts[trans->count] = 0;
		}
#ifdef DEBUG_PUSH
		printf("entering state %d\n", trans->to);
#endif
                if ((exec->comp->states[trans->to] != NULL) &&
		    (exec->comp->states[trans->to]->type ==
		     XML_REGEXP_SINK_STATE)) {
		    /*
		     * entering a sink state, save the current state as error
		     * state.
		     */
		    if (exec->errString != NULL)
			xmlFree(exec->errString);
		    exec->errString = xmlStrdup(value);
		    exec->errState = exec->state;
		    memcpy(exec->errCounts, exec->counts,
			   exec->comp->nbCounters * sizeof(int));
		}
		exec->state = exec->comp->states[trans->to];
		exec->transno = 0;
		if (trans->atom != NULL) {
		    if (exec->inputStack != NULL) {
			exec->index++;
			if (exec->index < exec->inputStackNr) {
			    value = exec->inputStack[exec->index].value;
			    data = exec->inputStack[exec->index].data;
#ifdef DEBUG_PUSH
			    printf("value loaded: %s\n", value);
#endif
			} else {
			    value = NULL;
			    data = NULL;
#ifdef DEBUG_PUSH
			    printf("end of input\n");
#endif
			}
		    } else {
			value = NULL;
			data = NULL;
#ifdef DEBUG_PUSH
			printf("end of input\n");
#endif
		    }
		}
		goto progress;
	    } else if (ret < 0) {
		exec->status = -4;
		break;
	    }
	}
	if ((exec->transno != 0) || (exec->state->nbTrans == 0)) {
rollback:
            /*
	     * if we didn't yet rollback on the current input
	     * store the current state as the error state.
	     */
	    if ((progress) && (exec->state != NULL) &&
	        (exec->state->type != XML_REGEXP_SINK_STATE)) {
	        progress = 0;
		if (exec->errString != NULL)
		    xmlFree(exec->errString);
		exec->errString = xmlStrdup(value);
		exec->errState = exec->state;
                if (exec->comp->nbCounters)
                    memcpy(exec->errCounts, exec->counts,
                           exec->comp->nbCounters * sizeof(int));
	    }

	    /*
	     * Failed to find a way out
	     */
	    exec->determinist = 0;
	    xmlFARegExecRollBack(exec);
	    if ((exec->inputStack != NULL ) && (exec->status == 0)) {
		value = exec->inputStack[exec->index].value;
		data = exec->inputStack[exec->index].data;
#ifdef DEBUG_PUSH
		printf("value loaded: %s\n", value);
#endif
	    }
	}
	continue;
progress:
        progress = 1;
	continue;
    }
    if (exec->status == 0) {
        return(exec->state->type == XML_REGEXP_FINAL_STATE);
    }
#ifdef DEBUG_ERR
    if (exec->status < 0) {
	testerr(exec);
    }
#endif
    return(exec->status);
}